

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::start_natpmp
          (session_impl *this,shared_ptr<libtorrent::aux::listen_socket_t> *s)

{
  session_impl *__args_1;
  bool bVar1;
  element_type *peVar2;
  address_v4 aVar3;
  undefined8 local_1e8;
  __weak_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1e0 [2];
  __shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2> local_1d0;
  ip_interface local_1c0;
  
  peVar2 = (s->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if ((peVar2->local_endpoint).impl_.data_.base.sa_family != 2) {
    local_1c0.interface_address.ipv6_address_.addr_.__in6_u._0_8_ =
         *(undefined8 *)((long)&(peVar2->local_endpoint).impl_.data_ + 8);
    local_1c0.interface_address.ipv6_address_.addr_.__in6_u._8_8_ =
         *(undefined8 *)((long)&(peVar2->local_endpoint).impl_.data_ + 0x10);
    local_1c0.interface_address.ipv6_address_.scope_id_ =
         (unsigned_long)(peVar2->local_endpoint).impl_.data_.v6.sin6_scope_id;
    local_1c0.interface_address.type_ = ipv6;
    local_1c0.interface_address.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    bVar1 = is_local(&local_1c0.interface_address);
    if (bVar1) {
      return;
    }
    peVar2 = (s->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  }
  if (((peVar2->natpmp_mapper).super___shared_ptr<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr == (element_type *)0x0) && (((peVar2->flags).m_val & 10) == 0)) {
    __args_1 = (session_impl *)this->m_io_context;
    ::std::__shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1d0,
               &s->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)
    ;
    ::std::__weak_ptr<libtorrent::aux::listen_socket_t,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<libtorrent::aux::listen_socket_t,void>
              ((__weak_ptr<libtorrent::aux::listen_socket_t,(__gnu_cxx::_Lock_policy)2> *)&local_1e8
               ,&local_1d0);
    ::std::
    make_shared<libtorrent::natpmp,boost::asio::io_context&,libtorrent::aux::session_impl&,libtorrent::aux::listen_socket_handle>
              ((io_context *)&local_1c0,__args_1,(listen_socket_handle *)this);
    ::std::__shared_ptr<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(((s->
                  super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->natpmp_mapper).
                super___shared_ptr<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2> *)&local_1c0);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_1c0.interface_address.ipv6_address_);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(a_Stack_1e0);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d0._M_refcount);
    aVar3.addr_.s_addr = (in4_addr_type)0;
    memset(local_1c0.friendly_name,0,0x100);
    local_1c0.preferred = true;
    local_1c0.flags.m_val = 1;
    local_1c0.state = unknown;
    peVar2 = (s->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    bVar1 = (peVar2->local_endpoint).impl_.data_.base.sa_family != 2;
    if (bVar1) {
      local_1e8 = *(undefined8 *)((long)&(peVar2->local_endpoint).impl_.data_ + 8);
      a_Stack_1e0[0]._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)&(peVar2->local_endpoint).impl_.data_ + 0x10);
      local_1c0.interface_address.ipv6_address_.scope_id_ =
           (unsigned_long)(peVar2->local_endpoint).impl_.data_.v6.sin6_scope_id;
    }
    else {
      aVar3.addr_.s_addr = (in4_addr_type)(peVar2->local_endpoint).impl_.data_.v6.sin6_flowinfo;
      local_1e8 = 0;
      a_Stack_1e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1c0.interface_address.ipv6_address_.scope_id_ = 0;
    }
    local_1c0.interface_address.ipv4_address_.addr_.s_addr = aVar3.addr_.s_addr;
    local_1c0.interface_address.type_ = (uint)bVar1;
    local_1c0.interface_address.ipv6_address_.addr_.__in6_u._0_8_ = local_1e8;
    local_1c0.interface_address.ipv6_address_.addr_.__in6_u._8_8_ = a_Stack_1e0[0]._M_pi;
    local_1c0.netmask.type_ = (peVar2->netmask).type_;
    local_1c0.netmask.ipv4_address_.addr_.s_addr = (peVar2->netmask).ipv4_address_.addr_;
    local_1c0.netmask.ipv6_address_.addr_.__in6_u._0_8_ =
         *(undefined8 *)&(peVar2->netmask).ipv6_address_.addr_.__in6_u;
    local_1c0.netmask.ipv6_address_.addr_.__in6_u._8_8_ =
         *(undefined8 *)((long)&(peVar2->netmask).ipv6_address_.addr_.__in6_u + 8);
    local_1c0.netmask.ipv6_address_.scope_id_ = (peVar2->netmask).ipv6_address_.scope_id_;
    strncpy(local_1c0.name,(peVar2->device)._M_dataplus._M_p,0x3f);
    local_1c0.name[0x3f] = '\0';
    natpmp::start((peVar2->natpmp_mapper).
                  super___shared_ptr<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                  &local_1c0);
  }
  return;
}

Assistant:

void session_impl::start_natpmp(std::shared_ptr<aux::listen_socket_t> const& s)
	{
		// don't create mappings for local IPv6 addresses
		// they can't be reached from outside of the local network anyways
		if (is_v6(s->local_endpoint) && is_local(s->local_endpoint.address()))
			return;

		if (!s->natpmp_mapper
			&& !(s->flags & listen_socket_t::local_network)
			&& !(s->flags & listen_socket_t::proxy))
		{
			// the natpmp constructor may fail and call the callbacks
			// into the session_impl.
			s->natpmp_mapper = std::make_shared<natpmp>(m_io_context, *this, listen_socket_handle(s));
			ip_interface ip;
			ip.interface_address = s->local_endpoint.address();
			ip.netmask = s->netmask;
			std::strncpy(ip.name, s->device.c_str(), sizeof(ip.name) - 1);
			ip.name[sizeof(ip.name) - 1] = '\0';
			s->natpmp_mapper->start(ip);
		}
	}